

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  xml_stream_chunk<char> *pxVar1;
  uint uVar2;
  xml_encoding encoding_00;
  long lVar3;
  long lVar4;
  xml_stream_chunk<char> *pxVar5;
  xml_stream_chunk<char> *pxVar6;
  ulong uVar7;
  xml_parse_status xVar8;
  ulong uVar9;
  ulong size;
  xml_stream_chunk<char> *pxVar10;
  void *result;
  bool bVar11;
  undefined1 auVar12 [16];
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> local_60;
  xml_encoding local_4c;
  xml_document *local_48;
  xml_parse_result *local_40;
  xml_document_struct *local_38;
  
  reset(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00174db7;
  }
  local_38 = (xml_document_struct *)(this->super_xml_node)._root;
  local_4c = encoding;
  local_48 = this;
  lVar3 = std::istream::tellg();
  if (lVar3 < 0) {
    pxVar10 = (xml_stream_chunk<char> *)0x0;
    local_40 = __return_storage_ptr__;
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_60.deleter = impl::anon_unknown_0::xml_stream_chunk<char>::destroy;
    uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    pxVar5 = (xml_stream_chunk<char> *)0x0;
    size = 0;
LAB_00174c48:
    if ((uVar2 & 2) != 0) {
      local_60.data = pxVar10;
      pxVar5 = (xml_stream_chunk<char> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(size + 1);
      if (pxVar5 != (xml_stream_chunk<char> *)0x0) {
        pxVar6 = pxVar5;
        for (; pxVar10 != (xml_stream_chunk<char> *)0x0; pxVar10 = pxVar10->next) {
          if ((xml_stream_chunk<char> *)(pxVar5->data + (size - 0x10)) <
              (xml_stream_chunk<char> *)(pxVar6->data + (pxVar10->size - 0x10))) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                          ,0x1316,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                         );
          }
          memcpy(pxVar6,pxVar10->data,pxVar10->size);
          pxVar6 = (xml_stream_chunk<char> *)(pxVar6->data + (pxVar10->size - 0x10));
        }
        xVar8 = status_ok;
        if (pxVar6 != (xml_stream_chunk<char> *)(pxVar5->data + (size - 0x10))) {
          __assert_fail("write == buffer + total",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x131b,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                       );
        }
        goto LAB_00174d44;
      }
      xVar8 = status_out_of_memory;
      goto LAB_00174d3e;
    }
    pxVar6 = (xml_stream_chunk<char> *)
             (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                       allocate)(0x7fe8);
    if (pxVar6 != (xml_stream_chunk<char> *)0x0) {
      pxVar6->next = (xml_stream_chunk<char> *)0x0;
      pxVar6->size = 0;
      pxVar1 = pxVar6;
      if (pxVar5 != (xml_stream_chunk<char> *)0x0) {
        pxVar5->next = pxVar6;
        pxVar1 = pxVar10;
      }
      pxVar10 = pxVar1;
      std::istream::read((char *)stream,(long)pxVar6->data);
      uVar9 = *(ulong *)(stream + 8);
      pxVar6->size = uVar9;
      uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
      if (((uVar2 & 1) == 0) && ((uVar2 & 6) != 4)) goto code_r0x00174cb7;
      xVar8 = status_io_error;
      local_60.data = pxVar10;
      goto LAB_00174d3e;
    }
    goto LAB_00174cd7;
  }
  auVar12 = std::istream::tellg();
  lVar3 = auVar12._0_8_;
  xVar8 = status_io_error;
  std::istream::seekg((long)stream,_S_beg);
  lVar4 = std::istream::tellg();
  std::istream::seekg(stream,lVar3,auVar12._8_8_);
  if (-1 < lVar3 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar9 = lVar4 - lVar3;
    if (-1 < (long)uVar9) {
      pxVar5 = (xml_stream_chunk<char> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(uVar9 + 1);
      local_60.deleter =
           (D)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      local_60.data = pxVar5;
      if (pxVar5 == (xml_stream_chunk<char> *)0x0) {
        xVar8 = status_out_of_memory;
LAB_00174d57:
        size = 0;
        pxVar5 = (xml_stream_chunk<char> *)0x0;
      }
      else {
        std::istream::read((char *)stream,(long)pxVar5);
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar8 = status_io_error;
          goto LAB_00174d57;
        }
        size = *(ulong *)(stream + 8);
        if (uVar9 < size) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x1340,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                       );
        }
        local_60.data = (xml_stream_chunk<char> *)0x0;
        xVar8 = status_ok;
      }
      impl::anon_unknown_0::auto_deleter<void>::~auto_deleter((auto_deleter<void> *)&local_60);
      goto LAB_00174da5;
    }
    xVar8 = status_out_of_memory;
  }
  goto LAB_00174dac;
code_r0x00174cb7:
  uVar7 = uVar9 + size;
  if (uVar9 + size <= size) {
    uVar7 = size;
  }
  bVar11 = CARRY8(uVar9,size);
  pxVar5 = pxVar6;
  size = uVar7;
  if (bVar11) goto LAB_00174cd7;
  goto LAB_00174c48;
LAB_00174cd7:
  xVar8 = status_out_of_memory;
  local_60.data = pxVar10;
LAB_00174d3e:
  size = 0;
  pxVar5 = (xml_stream_chunk<char> *)0x0;
LAB_00174d44:
  impl::anon_unknown_0::auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::
  ~auto_deleter(&local_60);
  __return_storage_ptr__ = local_40;
LAB_00174da5:
  if (xVar8 == status_ok) {
    local_48 = (xml_document *)&local_48->_buffer;
    encoding_00 = impl::anon_unknown_0::get_buffer_encoding(local_4c,pxVar5,size);
    if (encoding_00 == encoding_utf8) {
      pxVar5->data[size - 0x10] = '\0';
      size = size + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,local_38,&local_38->super_xml_node_struct,pxVar5,size,options,
               encoding_00,true,true,(char_t **)local_48);
    return __return_storage_ptr__;
  }
LAB_00174dac:
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar8;
LAB_00174db7:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<char, std::char_traits<char> >& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}